

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_algorithms.h
# Opt level: O0

void __thiscall
Labeling2D<(Connectivity2D)8,_false>::Labeling2D
          (Labeling2D<(Connectivity2D)8,_false> *this,
          unique_ptr<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_> *input,
          unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> *output)

{
  pointer pYVar1;
  Mat1b *pMVar2;
  pointer pYVar3;
  Mat1i *pMVar4;
  long *local_98;
  long *local_78;
  unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_> local_30;
  unique_ptr<YacclabTensorInput,_std::default_delete<YacclabTensorInput>_> local_28;
  unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> *local_20;
  unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> *output_local;
  unique_ptr<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_> *input_local;
  Labeling2D<(Connectivity2D)8,_false> *this_local;
  
  local_20 = output;
  output_local = (unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> *)
                 input;
  input_local = (unique_ptr<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_> *)this
  ;
  std::unique_ptr<YacclabTensorInput,std::default_delete<YacclabTensorInput>>::
  unique_ptr<YacclabTensorInput2D,std::default_delete<YacclabTensorInput2D>,void>
            ((unique_ptr<YacclabTensorInput,std::default_delete<YacclabTensorInput>> *)&local_28,
             input);
  std::unique_ptr<YacclabTensorOutput,std::default_delete<YacclabTensorOutput>>::
  unique_ptr<YacclabTensorOutput2D,std::default_delete<YacclabTensorOutput2D>,void>
            ((unique_ptr<YacclabTensorOutput,std::default_delete<YacclabTensorOutput>> *)&local_30,
             output);
  Labeling::Labeling(&this->super_Labeling,&local_28,&local_30);
  std::unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>::~unique_ptr
            (&local_30);
  std::unique_ptr<YacclabTensorInput,_std::default_delete<YacclabTensorInput>_>::~unique_ptr
            (&local_28);
  (this->super_Labeling)._vptr_Labeling = (_func_int **)&PTR__Labeling2D_0043f150;
  pYVar1 = std::unique_ptr<YacclabTensorInput,_std::default_delete<YacclabTensorInput>_>::get
                     (&(this->super_Labeling).input_);
  if (pYVar1 == (pointer)0x0) {
    local_78 = (long *)0x0;
  }
  else {
    local_78 = (long *)__dynamic_cast(pYVar1,&YacclabTensorInput::typeinfo,
                                      &YacclabTensorInput2D::typeinfo,0);
  }
  pMVar2 = (Mat1b *)(**(code **)(*local_78 + 0x38))();
  this->img_ = pMVar2;
  pYVar3 = std::unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>::get
                     (&(this->super_Labeling).output_);
  if (pYVar3 == (pointer)0x0) {
    local_98 = (long *)0x0;
  }
  else {
    local_98 = (long *)__dynamic_cast(pYVar3,&YacclabTensorOutput::typeinfo,
                                      &YacclabTensorOutput2D::typeinfo,0);
  }
  pMVar4 = (Mat1i *)(**(code **)(*local_98 + 0x48))();
  this->img_labels_ = pMVar4;
  return;
}

Assistant:

Labeling2D(std::unique_ptr<YacclabTensorInput2D> input, std::unique_ptr<YacclabTensorOutput2D> output) :
        Labeling(std::move(input), std::move(output)),
        img_((dynamic_cast<YacclabTensorInput2D*>(input_.get()))->Raw()),
        img_labels_((dynamic_cast<YacclabTensorOutput2D*>(output_.get()))->Raw()) {}